

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libskiwi.cpp
# Opt level: O0

uint64_t c_prim_eval(char *script)

{
  uint64_t __s;
  runtime_error *this;
  fptr p_Var1;
  allocator<char> local_59;
  string local_58;
  fptr local_38;
  fptr f;
  uint64_t size;
  uint64_t local_18;
  uint64_t return_value;
  char *script_local;
  
  local_18 = 0x27;
  return_value = (uint64_t)script;
  skiwi::save_compiler_data();
  __s = return_value;
  if ((skiwi::(anonymous_namespace)::cd[0] & 1) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Skiwi is not initialized");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,(char *)__s,&local_59);
  p_Var1 = skiwi::anon_unknown_1::compile
                     ((uint64_t *)&f,&local_58,
                      (environment_map *)(skiwi::(anonymous_namespace)::cd + 0x220),
                      (repl_data *)(skiwi::(anonymous_namespace)::cd + 0x188));
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = p_Var1;
  if (p_Var1 != (fptr)0x0) {
    local_18 = (*p_Var1)(skiwi::(anonymous_namespace)::cd + 0x30);
    std::
    vector<std::pair<unsigned_long(*)(void*,...),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,...),unsigned_long>>>
    ::emplace_back<unsigned_long(*&)(void*,___),unsigned_long&>
              ((vector<std::pair<unsigned_long(*)(void*,___),unsigned_long>,std::allocator<std::pair<unsigned_long(*)(void*,___),unsigned_long>>>
                *)(skiwi::(anonymous_namespace)::cd + 0x230),
               (_func_unsigned_long_void_ptr_varargs **)&local_38,(unsigned_long *)&f);
  }
  skiwi::restore_compiler_data();
  return local_18;
}

Assistant:

uint64_t c_prim_eval(const char* script)
  {
  uint64_t return_value = skiwi_undefined;
  using namespace skiwi;
  /*
   void* rbx = cd.ctxt.rbx;
   void* rdi = cd.ctxt.rdi;
   void* rsi = cd.ctxt.rsi;
   void* rsp = cd.ctxt.rsp;
   void* rbp = cd.ctxt.rbp;
   void* r12 = cd.ctxt.r12;
   void* r13 = cd.ctxt.r13;
   void* r14 = cd.ctxt.r14;
   void* r15 = cd.ctxt.r15;
   uint64_t* rsp_save = cd.ctxt.rsp_save; // state of RSP should be preserved, as it might contain RET information and so on
   uint64_t* stack_save = cd.ctxt.stack_save; // stack_save contains the stack position at the beginning of the scheme call. After the scheme call the stack should be at this position again. Therefore this value needs to be preserved.
   uint64_t* error_label = cd.ctxt.error_label; // Each scheme call has its error label to which to jump in case of error. It should thus be preserved.
   */
  save_compiler_data();

  if (!cd.initialized)
    throw std::runtime_error("Skiwi is not initialized");
  uint64_t size;
  auto f = compile(size, script, cd.env, cd.rd);
  if (f)
    {
#ifdef _SKIWI_FOR_ARM
    registers reg;
#ifdef _WIN32
    reg.rcx = (uint64_t)(&cd.ctxt);
#else
    reg.rdi = (uint64_t)(&cd.ctxt);
#endif
    run_bytecode(f, size, reg);
    cd.compiled_bytecode.emplace_back(f, size);
    return_value = reg.rax;
#else
    return_value = f(&cd.ctxt);
    cd.compiled_functions.emplace_back(f, size);
#endif
    }
  /*
   cd.ctxt.rbx = rbx;
   cd.ctxt.rdi = rdi;
   cd.ctxt.rsi = rsi;
   cd.ctxt.rsp = rsp;
   cd.ctxt.rbp = rbp;
   cd.ctxt.r12 = r12;
   cd.ctxt.r13 = r13;
   cd.ctxt.r14 = r14;
   cd.ctxt.r15 = r15;
   cd.ctxt.rsp_save = rsp_save;
   cd.ctxt.stack_save = stack_save;
   cd.ctxt.error_label = error_label;
   */
  restore_compiler_data();
  return return_value;
  }